

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_codec.c
# Opt level: O0

void set_error(aom_internal_error_info *info,aom_codec_err_t error,char *fmt,__va_list_tag *ap)

{
  __gnuc_va_list in_RCX;
  char *in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  size_t sz;
  
  *in_RDI = in_ESI;
  in_RDI[1] = 0;
  if (in_RDX != (char *)0x0) {
    in_RDI[1] = 1;
    vsnprintf((char *)(in_RDI + 2),199,in_RDX,in_RCX);
    *(undefined1 *)((long)in_RDI + 0xcf) = 0;
  }
  return;
}

Assistant:

static void set_error(struct aom_internal_error_info *info,
                      aom_codec_err_t error, const char *fmt, va_list ap) {
  info->error_code = error;
  info->has_detail = 0;

  if (fmt) {
    size_t sz = sizeof(info->detail);

    info->has_detail = 1;
    vsnprintf(info->detail, sz - 1, fmt, ap);
    info->detail[sz - 1] = '\0';
  }
}